

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

mat4 * dja::mat4::homogeneous::tile
                 (mat4 *__return_storage_ptr__,float_t left,float_t right,float_t bottom,float_t top
                 )

{
  float fVar1;
  float fVar2;
  
  if ((left != right) || (NAN(left) || NAN(right))) {
    if ((bottom != top) || (NAN(bottom) || NAN(top))) {
      fVar2 = 1.0 / (right - left);
      fVar1 = 1.0 / (top - bottom);
      __return_storage_ptr__->m[0].x = fVar2 + fVar2;
      __return_storage_ptr__->m[0].y = 0.0;
      __return_storage_ptr__->m[0].z = 0.0;
      __return_storage_ptr__->m[0].w = -(left + right) * fVar2;
      __return_storage_ptr__->m[1].x = 0.0;
      __return_storage_ptr__->m[1].y = fVar1 + fVar1;
      __return_storage_ptr__->m[1].z = 0.0;
      __return_storage_ptr__->m[1].w = -(bottom + top) * fVar1;
      __return_storage_ptr__->m[2].x = 0.0;
      __return_storage_ptr__->m[2].y = 0.0;
      __return_storage_ptr__->m[2].z = 1.0;
      *(undefined8 *)&__return_storage_ptr__->m[2].w = 0;
      __return_storage_ptr__->m[3].y = 0.0;
      __return_storage_ptr__->m[3].z = 0.0;
      __return_storage_ptr__->m[3].w = 1.0;
      return __return_storage_ptr__;
    }
  }
  __assert_fail("left != right && bottom != top",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_algebra/dj_algebra.h"
                ,0x379,
                "static mat4 dja::mat4::homogeneous::tile(float_t, float_t, float_t, float_t)");
}

Assistant:

mat4
mat4::homogeneous::tile(
    float_t left, float_t right,
    float_t bottom, float_t top
) {
    DJA_ASSERT(left != right && bottom != top);
    float_t c1 = float_t(1) / (right - left);
    float_t c2 = float_t(1) / (top - bottom);
    float_t d1 = float_t(2) * c1;
    float_t d2 = float_t(2) * c2;
    float_t tx = -(right + left) * c1;
    float_t ty = -(top + bottom) * c2;

    return mat4(d1, 0 , 0, tx,
                0 , d2, 0, ty,
                0 , 0 , 1,  0,
                0 , 0 , 0,  1);
}